

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O2

CutoffType icu_63::DayPeriodRulesDataSink::getCutoffTypeFromString(char *type_str)

{
  int iVar1;
  CutoffType CVar2;
  
  iVar1 = strcmp(type_str,"from");
  if (iVar1 == 0) {
    CVar2 = CUTOFF_TYPE_FROM;
  }
  else {
    iVar1 = strcmp(type_str,"before");
    if (iVar1 == 0) {
      CVar2 = CUTOFF_TYPE_BEFORE;
    }
    else {
      iVar1 = strcmp(type_str,"after");
      if (iVar1 == 0) {
        CVar2 = CUTOFF_TYPE_AFTER;
      }
      else {
        CVar2 = CUTOFF_TYPE_UNKNOWN;
        if ((*type_str == 'a') && (type_str[1] == 't')) {
          CVar2 = -(uint)(type_str[2] != '\0') | CUTOFF_TYPE_AT;
        }
      }
    }
  }
  return CVar2;
}

Assistant:

static CutoffType getCutoffTypeFromString(const char *type_str) {
        if (uprv_strcmp(type_str, "from") == 0) {
            return CUTOFF_TYPE_FROM;
        } else if (uprv_strcmp(type_str, "before") == 0) {
            return CUTOFF_TYPE_BEFORE;
        } else if (uprv_strcmp(type_str, "after") == 0) {
            return CUTOFF_TYPE_AFTER;
        } else if (uprv_strcmp(type_str, "at") == 0) {
            return CUTOFF_TYPE_AT;
        } else {
            return CUTOFF_TYPE_UNKNOWN;
        }
    }